

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Npas4.cpp
# Opt level: O0

int64_t npas4::GetRAMVirtualUsed(void)

{
  int64_t total;
  sysinfo memInfo;
  
  sysinfo((sysinfo *)&total);
  return (memInfo.bufferram - memInfo.totalswap) * (ulong)(uint)memInfo.freehigh;
}

Assistant:

int64_t npas4::GetRAMVirtualUsed()
{
#ifdef WIN32
	return npas4::GetRAMVirtualTotal() - npas4::GetRAMVirtualAvailable();
#else
	struct sysinfo memInfo;
	sysinfo(&memInfo);
	const int64_t total = memInfo.totalswap - memInfo.freeswap;
	return total * static_cast<int64_t>(memInfo.mem_unit);
#endif
}